

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtrans.cpp
# Opt level: O0

void init_windows(void)

{
  char *local_128;
  undefined4 local_120;
  undefined4 local_118;
  Am_Style *local_110;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  Am_Style *local_b8;
  Am_Drawonable *local_b0;
  undefined1 *local_a8;
  Am_Drawonable *local_a0;
  Am_Style *local_98;
  Am_Drawonable *local_90;
  undefined1 *local_88;
  Am_Drawonable *local_80;
  Am_Style *local_78;
  Am_Drawonable *local_70;
  undefined1 *local_68;
  Am_Drawonable *local_60;
  Am_Style *local_58;
  Am_Drawonable *local_50;
  undefined1 *local_48;
  Am_Drawonable *local_40;
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  Am_Style local_28 [24];
  Am_Style local_10 [8];
  
  root = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  local_58 = local_10;
  local_50 = root;
  Am_Style::Am_Style(local_58,(Am_Style *)&Am_No_Style);
  local_110 = local_58;
  local_128 = "";
  local_c0 = 0;
  local_c8 = 1;
  local_d0 = 0;
  local_d8 = 0;
  local_e0 = 1;
  local_e8 = 0;
  local_f0 = 0;
  local_f8 = 1;
  local_100 = 1;
  local_108 = 0;
  local_118 = 0;
  local_120 = 1;
  local_48 = (undefined1 *)&local_128;
  d1 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_50)(local_50,0x352,0xb4,0xdc,100,"D1");
  local_40 = d1;
  Am_Style::~Am_Style(local_10);
  local_70 = d1;
  local_78 = local_28;
  Am_Style::Am_Style(local_78,(Am_Style *)&Am_No_Style);
  local_110 = local_78;
  local_128 = "";
  local_c0 = 0;
  local_c8 = 1;
  local_d0 = 0;
  local_d8 = 0;
  local_e0 = 1;
  local_e8 = 0;
  local_f0 = 0;
  local_f8 = 1;
  local_100 = 1;
  local_108 = 0;
  local_118 = 0;
  local_120 = 1;
  local_68 = (undefined1 *)&local_128;
  d2 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_70)(local_70,0xfffffff1,0x16,0xaf,100,"D2")
  ;
  local_60 = d2;
  Am_Style::~Am_Style(local_28);
  local_90 = d2;
  local_98 = local_30;
  Am_Style::Am_Style(local_98,(Am_Style *)&Am_No_Style);
  local_110 = local_98;
  local_128 = "";
  local_c0 = 0;
  local_c8 = 1;
  local_d0 = 0;
  local_d8 = 0;
  local_e0 = 1;
  local_e8 = 0;
  local_f0 = 0;
  local_f8 = 1;
  local_100 = 1;
  local_108 = 0;
  local_118 = 0;
  local_120 = 1;
  local_88 = (undefined1 *)&local_128;
  d3 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_90)(local_90,0x1e,0x12,0x96,100,"D3");
  local_80 = d3;
  Am_Style::~Am_Style(local_30);
  local_b0 = root;
  local_b8 = local_38;
  Am_Style::Am_Style(local_b8,(Am_Style *)&Am_No_Style);
  local_110 = local_b8;
  local_128 = "";
  local_c0 = 0;
  local_c8 = 1;
  local_d0 = 0;
  local_d8 = 0;
  local_e0 = 1;
  local_e8 = 0;
  local_f0 = 0;
  local_f8 = 1;
  local_100 = 1;
  local_108 = 0;
  local_118 = 0;
  local_120 = 1;
  local_a8 = (undefined1 *)&local_128;
  d4 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_b0)(local_b0,800,0x140,0x96,100,"D4");
  local_a0 = d4;
  Am_Style::~Am_Style(local_38);
  (**(code **)(*(long *)d1 + 0x1b0))(d1,&Global_Handlers);
  (**(code **)(*(long *)d2 + 0x1b0))(d2,&Global_Handlers);
  (**(code **)(*(long *)d3 + 0x1b0))(d3,&Global_Handlers);
  (**(code **)(*(long *)d4 + 0x1b0))(d4,&Global_Handlers);
  return;
}

Assistant:

void
init_windows()
{
  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(850, 180, 220, 100, "D1");
  d2 = d1->Create(-15, 22, 175, 100, "D2");
  d3 = d2->Create(30, 18, 150, 100, "D3");
  d4 = root->Create(800, 320, 150, 100, "D4");

  d1->Set_Input_Dispatch_Functions(&Global_Handlers);
  d2->Set_Input_Dispatch_Functions(&Global_Handlers);
  d3->Set_Input_Dispatch_Functions(&Global_Handlers);
  d4->Set_Input_Dispatch_Functions(&Global_Handlers);
}